

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_aggregate_expression.cpp
# Opt level: O1

bool duckdb::IsFunctionallyDependent
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *deps)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  char cVar2;
  int iVar3;
  pointer pEVar4;
  type pEVar5;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this;
  bool bVar6;
  bool are_dependent;
  bool has_children;
  byte local_62;
  byte local_61;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  iVar3 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar4);
  if ((char)iVar3 == '\0') {
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expr);
    iVar3 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar4);
    local_62 = true;
    if ((char)iVar3 == '\0') {
      this = (deps->
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (deps->
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar6 = this == puVar1;
      local_60 = deps;
      if (!bVar6) {
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(expr);
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(this);
        iVar3 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[10])(pEVar4,pEVar5);
        cVar2 = (char)iVar3;
        while (cVar2 == '\0') {
          this = this + 1;
          bVar6 = this == puVar1;
          if (bVar6) goto LAB_00d92a54;
          pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(expr);
          pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(this);
          iVar3 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[10])(pEVar4,pEVar5);
          cVar2 = (char)iVar3;
        }
        if (!bVar6) {
          return true;
        }
      }
LAB_00d92a54:
      local_61 = 0;
      local_62 = 1;
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(expr);
      local_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_58._M_unused._M_object = operator_new(0x18);
      *(byte **)local_58._M_unused._0_8_ = &local_61;
      *(byte **)((long)local_58._M_unused._0_8_ + 8) = &local_62;
      *(vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        **)((long)local_58._M_unused._0_8_ + 0x10) = local_60;
      pcStack_40 = ::std::
                   _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_aggregate_expression.cpp:44:47)>
                   ::_M_invoke;
      local_48 = ::std::
                 _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_aggregate_expression.cpp:44:47)>
                 ::_M_manager;
      ExpressionIterator::EnumerateChildren
                (pEVar5,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
                         *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      local_62 = local_62 & local_61;
    }
  }
  else {
    local_62 = 0;
  }
  return (bool)local_62;
}

Assistant:

static bool IsFunctionallyDependent(const unique_ptr<Expression> &expr, const vector<unique_ptr<Expression>> &deps) {
	//	Volatile expressions can't depend on anything else
	if (expr->IsVolatile()) {
		return false;
	}
	//	Constant expressions are always FD
	if (expr->IsFoldable()) {
		return true;
	}
	// If the expression matches ANY of the dependencies, then it is FD on them
	for (const auto &dep : deps) {
		// We don't need to check volatility of the dependencies because we checked it for the expression.
		if (expr->Equals(*dep)) {
			return true;
		}
	}

	// The expression doesn't match any dependency, so check ALL children.
	bool has_children = false;
	bool are_dependent = true;
	ExpressionIterator::EnumerateChildren(*expr, [&](unique_ptr<Expression> &child) {
		has_children = true;
		are_dependent &= IsFunctionallyDependent(child, deps);
	});
	return has_children && are_dependent;
}